

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibi.cpp
# Opt level: O1

bool chibi_generate(char *in_cwd,char *src_path,char *dst_path,char **targets,int numTargets,
                   char *platform)

{
  long lVar1;
  allocator *paVar2;
  pointer ppCVar3;
  char cVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  string *psVar8;
  long lVar9;
  undefined1 *puVar10;
  char *pcVar11;
  ulong uVar12;
  pointer ppCVar13;
  bool bVar14;
  ChibiInfo chibi_info;
  char cwd [4096];
  char source_path [4096];
  char build_root [4096];
  char output_filename [4096];
  undefined1 auStack_40c8 [15];
  allocator local_40b9;
  char *local_40b8;
  allocator *local_40b0;
  char *local_40a8;
  char *local_40a0;
  ChibiInfo local_4098;
  undefined1 local_4038;
  undefined7 uStack_4037;
  undefined1 local_4028 [4080];
  allocator local_3038 [4096];
  char *local_2038;
  ulong local_2030;
  char local_2028 [4080];
  undefined2 *local_1038;
  undefined8 local_1030;
  undefined2 local_1028;
  char local_1026 [4086];
  
  puVar10 = auStack_40c8;
  local_4098.build_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_4098.build_targets._M_t._M_impl.super__Rb_tree_header._M_header;
  local_4098.build_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4098.build_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4098.build_targets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4098.libraries.super__Vector_base<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4098.libraries.super__Vector_base<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4098.libraries.super__Vector_base<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4098.cmake_module_paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4098.cmake_module_paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4098.cmake_module_paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40b8 = dst_path;
  local_40b0 = (allocator *)src_path;
  local_40a8 = platform;
  local_40a0 = in_cwd;
  local_4098.build_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_4098.build_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < numTargets) {
    uVar12 = 0;
    do {
      std::__cxx11::string::string((string *)&local_4038,targets[uVar12],local_3038);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&local_4098,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4038);
      if ((undefined1 *)CONCAT71(uStack_4037,local_4038) != local_4028) {
        operator_delete((undefined1 *)CONCAT71(uStack_4037,local_4038));
      }
      uVar12 = uVar12 + 1;
    } while ((uint)numTargets != uVar12);
  }
  if ((local_40a0 == (char *)0x0) || (cVar4 = *local_40a0, cVar4 == '\0')) {
    pcVar11 = &local_4038;
    pcVar6 = getcwd(pcVar11,0x1000);
    if (pcVar6 != (char *)0x0) {
      do {
        if (*pcVar11 == '\\') {
          *pcVar11 = '/';
        }
        else if (*pcVar11 == '\0') goto LAB_0010924e;
        pcVar11 = pcVar11 + 1;
      } while( true );
    }
    goto LAB_001092e7;
  }
  lVar7 = 0;
  do {
    lVar9 = lVar7;
    (&local_4038)[lVar9] = cVar4;
    cVar4 = local_40a0[lVar9 + 1];
    if (cVar4 == '\0') break;
    lVar7 = lVar9 + 1;
  } while ((int)lVar9 != 0xfff);
  if ((int)(lVar9 + 1) != 0x1000 && cVar4 == '\0') {
    *(undefined1 *)((long)&uStack_4037 + lVar9) = 0;
    goto LAB_00109257;
  }
  pcVar11 = "failed to copy cwd string";
LAB_0010956d:
  uVar12 = 0;
  report_error((char *)0x0,pcVar11);
LAB_00109579:
  ChibiInfo::~ChibiInfo(&local_4098);
  return SUB81(uVar12,0);
LAB_0010924e:
  if (pcVar6 == (char *)0x0) {
LAB_001092e7:
    pcVar11 = "failed to get current working directory";
  }
  else {
LAB_00109257:
    paVar2 = local_40b0;
    iVar5 = strcmp((char *)local_40b0,".");
    if (iVar5 == 0) {
      bVar14 = local_4038 == (allocator)0x0;
      if (!bVar14) {
        lVar7 = 0;
        do {
          local_3038[lVar7] = local_4038;
          lVar9 = lVar7 + 1;
          local_4038 = *(allocator *)((long)&uStack_4037 + lVar7);
          if (local_4038 == (allocator)0x0) break;
          iVar5 = (int)lVar7;
          lVar7 = lVar9;
        } while (iVar5 != 0xfff);
LAB_001093ca:
        bVar14 = (int)lVar9 != 0x1000 && local_4038 == (allocator)0x0;
        puVar10 = auStack_40c8 + lVar9;
      }
LAB_001093ee:
      if (bVar14) {
        puVar10[0x1090] = 0;
LAB_001093f9:
        bVar14 = find_chibi_build_root((char *)local_3038,(char *)&local_2038,0x1000);
        if (bVar14) {
          printf("source_path: %s\n",local_3038);
          printf("destination_path: %s\n",local_40b8);
          printf("build_root: %s\n",&local_2038);
          bVar14 = chibi_process(&local_4098,(char *)&local_2038,false,local_40a8);
          ppCVar3 = local_4098.libraries.
                    super__Vector_base<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          uVar12 = 0;
          if (!bVar14) goto LAB_00109579;
          if (local_4098.libraries.
              super__Vector_base<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_4098.libraries.
              super__Vector_base<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            uVar12 = 0;
            ppCVar13 = local_4098.libraries.
                       super__Vector_base<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
            do {
              bVar14 = ChibiInfo::should_build_target
                                 (&local_4098,((*ppCVar13)->name)._M_dataplus._M_p);
              uVar12 = (ulong)((int)uVar12 + (uint)bVar14);
              ppCVar13 = ppCVar13 + 1;
            } while (ppCVar13 != ppCVar3);
          }
          printf("found %d libraries and apps in total, of which %d marked as target\n",
                 (ulong)((long)local_4098.libraries.
                               super__Vector_base<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_4098.libraries.
                              super__Vector_base<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3,uVar12);
          bVar14 = chibi::concat((char *)&local_1038,0x1000,local_40b8,"/","CMakeLists.txt",
                                 (char *)0x0);
          if (!bVar14) goto LAB_0010955d;
          psVar8 = &s_platform_abi_cxx11_;
          if (s_platform_full_abi_cxx11_._M_string_length != 0) {
            psVar8 = &s_platform_full_abi_cxx11_;
          }
          bVar14 = chibi::write_cmake_file
                             (&local_4098,(psVar8->_M_dataplus)._M_p,(char *)&local_1038);
          if (bVar14) {
            bVar14 = is_platform("android");
            uVar12 = 1;
            if ((!bVar14) || (bVar14 = chibi::write_gradle_files(&local_4098,local_40b8), bVar14))
            goto LAB_00109579;
            pcVar11 = "an error occured while generating gradle files";
          }
          else {
            pcVar11 = "an error occured while generating cmake file";
          }
        }
        else {
          pcVar11 = "failed to find chibi-root.txt file";
        }
        goto LAB_0010956d;
      }
    }
    else {
      std::__cxx11::string::string((string *)&local_2038,(char *)paVar2,&local_40b9);
      local_1038 = &local_1028;
      local_1028 = 0x2f2e;
      local_1030 = 2;
      local_1026[0] = '\0';
      if ((local_2030 < 2) || (*local_2038 != '.')) {
        bVar14 = false;
      }
      else {
        lVar7 = -1;
        do {
          if (lVar7 == 0) {
            lVar9 = 1;
            break;
          }
          lVar1 = lVar7 + 2;
          lVar9 = lVar7 + 1;
          pcVar11 = local_1026 + lVar7;
          lVar7 = lVar9;
        } while (local_2038[lVar1] == *pcVar11);
        bVar14 = lVar9 != 0;
      }
      if (local_2038 != local_2028) {
        operator_delete(local_2038);
      }
      if (!bVar14) {
        local_4038 = *local_40b0;
        bVar14 = local_4038 == (allocator)0x0;
        puVar10 = auStack_40c8;
        if (!bVar14) {
          lVar7 = 0;
          do {
            local_3038[lVar7] = local_4038;
            lVar9 = lVar7 + 1;
            local_4038 = local_40b0[lVar7 + 1];
            if (local_4038 == (allocator)0x0) break;
            iVar5 = (int)lVar7;
            lVar7 = lVar9;
          } while (iVar5 != 0xfff);
          goto LAB_001093ca;
        }
        goto LAB_001093ee;
      }
      bVar14 = chibi::concat((char *)local_3038,0x1000,&local_4038,"/",(char *)(local_40b0 + 2),
                             (char *)0x0);
      if (bVar14) goto LAB_001093f9;
    }
LAB_0010955d:
    pcVar11 = "failed to create absolute path";
  }
  goto LAB_0010956d;
}

Assistant:

bool chibi_generate(const char * in_cwd, const char * src_path, const char * dst_path, const char ** targets, const int numTargets, const char * platform)
{
	ChibiInfo chibi_info;
	
	for (int i = 0; i < numTargets; ++i)
		chibi_info.build_targets.insert(targets[i]);
	
	//
	
	char cwd[PATH_MAX];
	
	if (in_cwd == nullptr || in_cwd[0] == 0)
	{
		// get the current working directory. this is the root of our operations

		if (get_current_working_directory(cwd, sizeof(cwd)) == false)
		{
			report_error(nullptr, "failed to get current working directory");
			return false;
		}
	}
	else
	{
		if (!copy_string(cwd, sizeof(cwd), in_cwd))
		{
			report_error(nullptr, "failed to copy cwd string");
			return false;
		}
	}
	
	//
	
	char source_path[PATH_MAX];
	
	if (create_absolute_path_given_cwd(cwd, src_path, source_path, sizeof(source_path)) == false)
	{
		report_error(nullptr, "failed to create absolute path");
		return false;
	}

	
	// recursively find build_root
	
	char build_root[PATH_MAX];
	
	if (find_chibi_build_root(source_path, build_root, sizeof(build_root)) == false)
	{
		report_error(nullptr, "failed to find chibi-root.txt file");
		return false;
	}
	
#if 1
	printf("source_path: %s\n", source_path);
	printf("destination_path: %s\n", dst_path);
	printf("build_root: %s\n", build_root);
#endif

	if (chibi_process(chibi_info, build_root, false, platform) == false)
		return false;
	
	int num_build_targets = 0;
	for (auto * library : chibi_info.libraries)
		if (chibi_info.should_build_target(library->name.c_str()))
			num_build_targets++;
		
	printf("found %d libraries and apps in total, of which %d marked as target\n", (int)chibi_info.libraries.size(), num_build_targets);
	
	// write cmake file
	
	char output_filename[PATH_MAX];
	
	if (!concat(output_filename, sizeof(output_filename), dst_path, "/", "CMakeLists.txt"))
	{
		report_error(nullptr, "failed to create absolute path");
		return false;
	}
	
	if (!write_cmake_file(
		chibi_info,
		!s_platform_full.empty()
			? s_platform_full.c_str()
			: s_platform.c_str(),
		output_filename))
	{
		report_error(nullptr, "an error occured while generating cmake file");
		return false;
	}

	// write gradle files
	
	if (is_platform("android"))
	{
		if (!write_gradle_files(chibi_info, dst_path))
		{
			report_error(nullptr, "an error occured while generating gradle files");
			return false;
		}
	}

	return true;
}